

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall google::protobuf::internal::ExtensionSet::MessageSetByteSize(ExtensionSet *this)

{
  KeyValue *pKVar1;
  size_t sVar2;
  KeyValue *this_00;
  KeyValue *pKVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  size_t sVar7;
  bool bVar8;
  iterator iVar9;
  iterator iVar10;
  size_t local_38;
  
  local_38 = 0;
  lVar4 = (long)(short)this->flat_size_;
  this_00 = (this->map_).flat;
  if (lVar4 < 0) {
    iVar9 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            ::begin((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                     *)this_00);
    iVar10 = absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                    *)(this->map_).flat);
    ForEachPrefetchImpl<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::MessageSetByteSize()const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
              ((ExtensionSet *)iVar9.node_,iVar9.position_,iVar10.node_,iVar10._8_8_ & 0xffffffff,
               &local_38);
    sVar7 = local_38;
  }
  else {
    lVar5 = lVar4 * 0x20;
    pKVar1 = this_00 + lVar4;
    pKVar3 = this_00;
    if (this->flat_size_ != 0) {
      uVar6 = 0;
      do {
        lVar5 = lVar5 + -0x20;
        Extension::PrefetchPtr(&pKVar3->second);
        pKVar3 = pKVar3 + 1;
        if (lVar5 == 0) break;
        bVar8 = uVar6 < 0xf;
        uVar6 = uVar6 + 1;
      } while (bVar8);
    }
    sVar7 = 0;
    for (; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
      sVar2 = Extension::MessageSetItemByteSize(&this_00->second,this_00->first);
      sVar7 = sVar7 + sVar2;
      Extension::PrefetchPtr(&pKVar3->second);
      this_00 = this_00 + 1;
    }
    for (; this_00 != pKVar1; this_00 = this_00 + 1) {
      sVar2 = Extension::MessageSetItemByteSize(&this_00->second,this_00->first);
      sVar7 = sVar7 + sVar2;
    }
  }
  return sVar7;
}

Assistant:

size_t ExtensionSet::MessageSetByteSize() const {
  size_t total_size = 0;
  ForEach(
      [&total_size](int number, const Extension& ext) {
        total_size += ext.MessageSetItemByteSize(number);
      },
      Prefetch{});
  return total_size;
}